

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<double>::Write
          (TPZDohrSubstructCondense<double> *this,TPZStream *out,int withclassid)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  size_type sVar3;
  pointer ppVar4;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar5;
  map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
  *in_RSI;
  long in_RDI;
  int zero_1;
  int one_2;
  int b;
  int a;
  int sc;
  const_iterator it;
  int four;
  int three;
  int two;
  int one;
  int zero;
  int one_1;
  map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
  *in_stack_ffffffffffffff88;
  int withclassid_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  _Self in_stack_ffffffffffffffa0;
  ENumbering local_58;
  ENumbering local_54;
  _Self local_50;
  _Base_ptr local_48;
  undefined4 local_3c;
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
  in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18 [2];
  map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 8));
  if (bVar1) {
    local_18[0] = 1;
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,local_18,1);
    pTVar5 = TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator->
                       ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)(in_RDI + 8));
    (*(pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[5])
              (pTVar5,local_10,0);
  }
  else {
    local_1c = 0;
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_1c,1);
  }
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,in_RDI + 0x10,1);
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,in_RDI + 0x14,1);
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,in_RDI + 0x18,1);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(in_RDI + 0x10));
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x14));
  poVar2 = std::operator<<(poVar2," ");
  this_00 = (void *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x18));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZStream::Write<int>
            ((TPZStream *)in_stack_ffffffffffffffa0._M_node,
             (TPZVec<int> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  poVar2 = ::operator<<((ostream *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (TPZVec<int> *)in_stack_ffffffffffffffc8._M_node);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_20 = 1;
  local_24 = 2;
  local_28 = 3;
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_20,1);
  TPZFMatrix<double>::Write
            ((TPZFMatrix<double> *)in_stack_ffffffffffffffa0._M_node,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int)((ulong)in_RDI >> 0x20));
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_24,1);
  TPZFMatrix<double>::Write
            ((TPZFMatrix<double> *)in_stack_ffffffffffffffa0._M_node,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int)((ulong)in_RDI >> 0x20));
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_28,1);
  TPZStream::Write<double>
            ((TPZStream *)in_stack_ffffffffffffffa0._M_node,
             (TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZFMatrix<double>::Write
            ((TPZFMatrix<double> *)in_stack_ffffffffffffffa0._M_node,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int)((ulong)in_RDI >> 0x20));
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&stack0xffffffffffffffd4,1);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
              *)&stack0xffffffffffffffc8);
  sVar3 = std::
          map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::size((map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                  *)0x1faa7b2);
  local_3c = (undefined4)sVar3;
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_3c,1);
  local_48 = (_Base_ptr)
             std::
             map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
             ::begin(in_stack_ffffffffffffff88);
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc8,&local_50);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                           *)0x1faa823);
    local_54 = (ppVar4->first).first;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                           *)0x1faa833);
    local_58 = (ppVar4->first).second;
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_54,1);
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&local_58,1);
    in_stack_ffffffffffffff88 = local_10;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                  *)0x1faa877);
    TPZStream::Write<int>
              ((TPZStream *)in_stack_ffffffffffffffa0._M_node,
               (TPZVec<int> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffffa0 =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
         ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (int)((ulong)in_RDI >> 0x20));
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x298));
  if (bVar1) {
    in_stack_ffffffffffffff9c = 1;
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&stack0xffffffffffffff9c,1);
    pTVar5 = TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator->
                       ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)(in_RDI + 0x298))
    ;
    withclassid_00 = (int)((ulong)in_RDI >> 0x20);
    (*(pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[5])
              (pTVar5,local_10,0);
  }
  else {
    in_stack_ffffffffffffff98 = 0;
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&stack0xffffffffffffff98,1);
    withclassid_00 = (int)((ulong)in_RDI >> 0x20);
  }
  TPZFMatrix<double>::Write
            ((TPZFMatrix<double> *)in_stack_ffffffffffffffa0._M_node,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             withclassid_00);
  TPZFMatrix<double>::Write
            ((TPZFMatrix<double> *)in_stack_ffffffffffffffa0._M_node,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             withclassid_00);
  TPZFMatrix<double>::Write
            ((TPZFMatrix<double> *)in_stack_ffffffffffffffa0._M_node,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             withclassid_00);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Write(TPZStream &out, int withclassid) const
{    
    SAVEABLE_STR_NOTE(out,"fMatRedComplete");
    if(fMatRedComplete)
    {
        int one = 1;
        out.Write(&one);
        fMatRedComplete->Write(out,0);
    }
    else {
        int zero = 0;
        out.Write(&zero);
    }
    SAVEABLE_STR_NOTE(out,"fNEquations");
    out.Write(&fNEquations);
    SAVEABLE_STR_NOTE(out,"fNumInternalEquations");
    out.Write(&fNumInternalEquations);
    SAVEABLE_STR_NOTE(out,"fNumExternalEquations");
    out.Write(&fNumExternalEquations);
    std::cout << fNEquations << " " << fNumInternalEquations << " " << fNumExternalEquations << std::endl;
    out.Write( fCoarseNodes);
    std::cout << fCoarseNodes << std::endl;
    int one(1),two(2),three(3),four(4);
    
    out.Write(&one);
    fPhiC.Write(out, 0);
    out.Write(&two);
    fPhiC_Weighted_Condensed.Write(out, 0);
    out.Write(&three);
    out.Write( fWeights);
    fKCi.Write(out, 0);
    out.Write(&four);
    typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator it;
    int sc = fPermutationsScatter.size();
    out.Write(&sc);
    for (it=fPermutationsScatter.begin(); it != fPermutationsScatter.end(); it++) {
        int a = it->first.first;
        int b = it->first.second;
        out.Write(&a);
        out.Write(&b);
        out.Write( it->second);
    }
    if (fMatRed) {
        int one = 1;
        out.Write(&one);
        fMatRed->Write(out, 0);
    }
    else {
        int zero = 0;
        out.Write(&zero);
    }
    
    fLocalLoad.Write(out, 0);
    fLocalWeightedResidual.Write(out, 0);
    fAdjustSolution.Write(out, 0);

}